

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

void * tcg_malloc_internal_sparc(TCGContext_conflict7 *s,int size)

{
  TCGPool *pTVar1;
  TCGPool *pTVar2;
  
  if (size < 0x8001) {
    if (s->pool_current == (TCGPool *)0x0) {
      pTVar1 = s->pool_first;
    }
    else {
      pTVar1 = s->pool_current->next;
    }
    if (pTVar1 == (TCGPool *)0x0) {
      pTVar1 = (TCGPool *)g_malloc(0x8010);
      pTVar1->size = 0x8000;
      pTVar1->next = (TCGPool *)0x0;
      pTVar2 = (TCGPool *)&s->pool_first;
      if (s->pool_current != (TCGPool *)0x0) {
        pTVar2 = s->pool_current;
      }
      pTVar2->next = pTVar1;
    }
    s->pool_current = pTVar1;
    s->pool_cur = (uint8_t *)((long)&pTVar1[1].next + (long)size);
    s->pool_end = (uint8_t *)((long)&pTVar1[1].next + (long)pTVar1->size);
  }
  else {
    pTVar1 = (TCGPool *)g_malloc((ulong)(size + 0x10));
    pTVar1->size = size;
    pTVar1->next = s->pool_first_large;
    s->pool_first_large = pTVar1;
  }
  return pTVar1 + 1;
}

Assistant:

void *tcg_malloc_internal(TCGContext *s, int size)
{
    TCGPool *p;
    int pool_size;
    
    if (size > TCG_POOL_CHUNK_SIZE) {
        /* big malloc: insert a new pool (XXX: could optimize) */
        p = g_malloc(sizeof(TCGPool) + size);
        p->size = size;
        p->next = s->pool_first_large;
        s->pool_first_large = p;
        return p->data;
    } else {
        p = s->pool_current;
        if (!p) {
            p = s->pool_first;
            if (!p)
                goto new_pool;
        } else {
            if (!p->next) {
            new_pool:
                pool_size = TCG_POOL_CHUNK_SIZE;
                p = g_malloc(sizeof(TCGPool) + pool_size);
                p->size = pool_size;
                p->next = NULL;
                if (s->pool_current) 
                    s->pool_current->next = p;
                else
                    s->pool_first = p;
            } else {
                p = p->next;
            }
        }
    }
    s->pool_current = p;
    s->pool_cur = p->data + size;
    s->pool_end = p->data + p->size;
    return p->data;
}